

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::resizeEvent(QMdiArea *this,QResizeEvent *resizeEvent)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  QMdiAreaPrivate *pQVar4;
  const_iterator o;
  QEvent *in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiAreaPrivate *in_stack_00000008;
  QMdiSubWindow *child;
  QList<QPointer<QMdiSubWindow>_> *__range1;
  bool hasMaximizedSubWindow;
  QMdiAreaPrivate *d;
  QSize minSizeHint;
  QSize realSize;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPointer<QMdiSubWindow>_> subWindows;
  uint7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QMdiAreaPrivate *in_stack_ffffffffffffff78;
  QSize *this_00;
  QMdiAreaPrivate *s;
  QSize in_stack_ffffffffffffffa8;
  const_iterator local_28;
  QSize local_20;
  QMdiAreaPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s = in_RDI;
  pQVar4 = d_func((QMdiArea *)0x614385);
  bVar2 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x61439b);
  if (bVar2) {
    QEvent::ignore(in_RSI);
  }
  else {
    QMdiAreaPrivate::updateTabBarGeometry(in_stack_ffffffffffffffe8);
    if ((pQVar4->isSubWindowsTiled & 1U) == 0) {
      bVar2 = false;
      local_20 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QList<QPointer<QMdiSubWindow>_>::QList
                ((QList<QPointer<QMdiSubWindow>_> *)in_RDI,
                 (QList<QPointer<QMdiSubWindow>_> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      this_00 = &local_20;
      local_28.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QList<QPointer<QMdiSubWindow>_>::begin((QList<QPointer<QMdiSubWindow>_> *)in_RDI);
      o = QList<QPointer<QMdiSubWindow>_>::end((QList<QPointer<QMdiSubWindow>_> *)in_RDI);
      while (bVar3 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_28,o), bVar3
            ) {
        QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_28);
        in_stack_ffffffffffffff78 =
             (QMdiAreaPrivate *)
             ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x6144cd);
        bVar3 = sanityCheck((QMdiSubWindow *)in_RDI,
                            (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        in_stack_ffffffffffffff6f = false;
        if (bVar3) {
          bVar3 = QWidget::isMaximized((QWidget *)in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff6f = false;
          if (bVar3) {
            QWidget::size((QWidget *)(ulong)in_stack_ffffffffffffff68);
            QResizeEvent::size((QResizeEvent *)in_RSI);
            in_stack_ffffffffffffff6f =
                 ::operator!=((QSize *)in_RDI,
                              (QSize *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
                             );
          }
        }
        if ((bool)in_stack_ffffffffffffff6f != false) {
          QResizeEvent::size((QResizeEvent *)in_RSI);
          (**(code **)(*(long *)&(in_stack_ffffffffffffff78->super_QAbstractScrollAreaPrivate).
                                 super_QFramePrivate.super_QWidgetPrivate + 0x78))();
          bVar3 = QSize::isValid(this_00);
          if (bVar3) {
            in_stack_ffffffffffffffa8 =
                 QSize::expandedTo((QSize *)in_stack_ffffffffffffff78,(QSize *)in_RDI);
          }
          QWidget::resize((QWidget *)in_stack_ffffffffffffffa8,(QSize *)s);
          if (!bVar2) {
            bVar2 = true;
          }
        }
        QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_28);
      }
      QMdiAreaPrivate::updateScrollBars(in_stack_00000008);
      if (bVar2) {
        QMdiAreaPrivate::startResizeTimer(in_stack_ffffffffffffff78);
      }
      else {
        QMdiAreaPrivate::arrangeMinimizedSubWindows(in_RDI);
      }
      QList<QPointer<QMdiSubWindow>_>::~QList((QList<QPointer<QMdiSubWindow>_> *)0x614609);
    }
    else {
      pQVar4->tileCalledFromResizeEvent = true;
      tileSubWindows((QMdiArea *)in_RDI);
      pQVar4->tileCalledFromResizeEvent = false;
      pQVar4->isSubWindowsTiled = true;
      QMdiAreaPrivate::startResizeTimer(in_stack_ffffffffffffff78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiArea::resizeEvent(QResizeEvent *resizeEvent)
{
    Q_D(QMdiArea);
    if (d->childWindows.isEmpty()) {
        resizeEvent->ignore();
        return;
    }

#if QT_CONFIG(tabbar)
    d->updateTabBarGeometry();
#endif

    // Re-tile the views if we're in tiled mode. Re-tile means we will change
    // the geometry of the children, which in turn means 'isSubWindowsTiled'
    // is set to false, so we have to update the state at the end.
    if (d->isSubWindowsTiled) {
        d->tileCalledFromResizeEvent = true;
        tileSubWindows();
        d->tileCalledFromResizeEvent = false;
        d->isSubWindowsTiled = true;
        d->startResizeTimer();
        // We don't have scroll bars or any maximized views.
        return;
    }

    // Resize maximized views.
    bool hasMaximizedSubWindow = false;
    // Take a copy because child->resize() may call QCoreApplication::sendEvent()
    // which may invoke unknown code, that could e.g. recurse into the class
    // modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (sanityCheck(child, "QMdiArea::resizeEvent") && child->isMaximized()
                && child->size() != resizeEvent->size()) {
            auto realSize = resizeEvent->size();
            const auto minSizeHint = child->minimumSizeHint();
            // QMdiSubWindow is no tlw so minimumSize() is not set by the layout manager
            // and therefore we have to take care by ourself that we're not getting smaller
            // than allowed
            if (minSizeHint.isValid())
                realSize = realSize.expandedTo(minSizeHint);
            child->resize(realSize);
            if (!hasMaximizedSubWindow)
                hasMaximizedSubWindow = true;
        }
    }

    d->updateScrollBars();

    // Minimized views are stacked under maximized views so there's
    // no need to re-arrange minimized views on-demand. Start a timer
    // just to make things faster with subsequent resize events.
    if (hasMaximizedSubWindow)
        d->startResizeTimer();
    else
        d->arrangeMinimizedSubWindows();
}